

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_resolve.cpp
# Opt level: O0

void __thiscall
BamTools::ResolveTool::ReadNamesFileWriter::Write
          (ReadNamesFileWriter *this,string *readGroupName,string *readName)

{
  ostream *poVar1;
  string *in_RDX;
  string *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,in_RSI);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = std::operator<<(poVar1,in_RDX);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ResolveTool::ReadNamesFileWriter::Write(const std::string& readGroupName,
                                             const std::string& readName)
{
    m_stream << readGroupName << TAB_CHAR << readName << std::endl;
}